

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O2

bool __thiscall
cmMacroFunctionBlocker::IsFunctionBlocked
          (cmMacroFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *param_3)

{
  int iVar1;
  cmMacroHelperCommand *this_00;
  cmState *pcVar2;
  string newName;
  allocator local_51;
  long *local_50;
  string local_48;
  
  iVar1 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"macro");
  if (iVar1 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    iVar1 = cmsys::SystemTools::Strucmp
                      ((lff->super_cmCommandContext).Name._M_dataplus._M_p,"endmacro");
    if (iVar1 == 0) {
      if (this->Depth == 0) {
        std::__cxx11::string::string((string *)&local_48,"MACROS",&local_51);
        cmMakefile::AppendProperty
                  (mf,&local_48,
                   (((this->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,false);
        std::__cxx11::string::~string((string *)&local_48);
        this_00 = (cmMacroHelperCommand *)operator_new(0xc0);
        cmMacroHelperCommand::cmMacroHelperCommand(this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&this_00->Args,&this->Args);
        std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator=
                  (&this_00->Functions,&this->Functions);
        std::__cxx11::string::_M_assign((string *)&this_00->FilePath);
        cmMakefile::RecordPolicies(mf,&this_00->Policies);
        std::operator+(&local_48,"_",
                       (this->Args).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
        pcVar2 = cmMakefile::GetState(mf);
        cmState::RenameCommand
                  (pcVar2,(this->Args).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,&local_48);
        pcVar2 = cmMakefile::GetState(mf);
        cmState::AddCommand(pcVar2,(cmCommand *)this_00);
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)&local_50,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        if (local_50 != (long *)0x0) {
          (**(code **)(*local_50 + 0x18))();
        }
        std::__cxx11::string::~string((string *)&local_48);
        return true;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmMacroFunctionBlocker::
IsFunctionBlocked(const cmListFileFunction& lff, cmMakefile &mf,
                  cmExecutionStatus &)
{
  // record commands until we hit the ENDMACRO
  // at the ENDMACRO call we shift gears and start looking for invocations
  if(!cmSystemTools::Strucmp(lff.Name.c_str(),"macro"))
    {
    this->Depth++;
    }
  else if(!cmSystemTools::Strucmp(lff.Name.c_str(),"endmacro"))
    {
    // if this is the endmacro for this macro then execute
    if (!this->Depth)
      {
      mf.AppendProperty("MACROS", this->Args[0].c_str());
      // create a new command and add it to cmake
      cmMacroHelperCommand *f = new cmMacroHelperCommand();
      f->Args = this->Args;
      f->Functions = this->Functions;
      f->FilePath = this->GetStartingContext().FilePath;
      mf.RecordPolicies(f->Policies);
      std::string newName = "_" + this->Args[0];
      mf.GetState()->RenameCommand(this->Args[0], newName);
      mf.GetState()->AddCommand(f);

      // remove the function blocker now that the macro is defined
      mf.RemoveFunctionBlocker(this, lff);
      return true;
      }
    else
      {
      // decrement for each nested macro that ends
      this->Depth--;
      }
    }

  // if it wasn't an endmacro and we are not executing then we must be
  // recording
  this->Functions.push_back(lff);
  return true;
}